

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_listener.cpp
# Opt level: O3

int __thiscall
zmq::tcp_listener_t::accept(tcp_listener_t *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  uint __fd_00;
  pointer ptVar1;
  pointer ptVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint *puVar7;
  socklen_t *__addr_len_00;
  socklen_t *__addr_len_01;
  socklen_t *__addr_len_02;
  sockaddr *__addr_00;
  long lVar8;
  long lVar9;
  socklen_t ss_len;
  sockaddr_storage ss;
  socklen_t local_ac;
  sockaddr local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  iVar4 = (this->super_stream_listener_base_t)._s;
  if (iVar4 == -1) {
    accept((int)this + 0x578,&local_a8,(socklen_t *)__addr);
    iVar4 = local_a8._0_4_;
  }
  __addr_00 = &local_a8;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8.sa_family = 0;
  local_a8.sa_data[0] = '\0';
  local_a8.sa_data[1] = '\0';
  local_a8.sa_data[2] = '\0';
  local_a8.sa_data[3] = '\0';
  local_a8.sa_data[4] = '\0';
  local_a8.sa_data[5] = '\0';
  local_a8.sa_data[6] = '\0';
  local_a8.sa_data[7] = '\0';
  local_a8.sa_data[8] = '\0';
  local_a8.sa_data[9] = '\0';
  local_a8.sa_data[10] = '\0';
  local_a8.sa_data[0xb] = '\0';
  local_a8.sa_data[0xc] = '\0';
  local_a8.sa_data[0xd] = '\0';
  local_ac = 0x80;
  iVar4 = accept4(iVar4,__addr_00,&local_ac,0x80000);
  if (iVar4 == -1) {
    puVar7 = (uint *)__errno_location();
    __fd_00 = *puVar7;
    iVar4 = -1;
    if (((0x18 < __fd_00) || ((0x1801810U >> (__fd_00 & 0x1f) & 1) == 0)) &&
       ((0x22 < __fd_00 - 0x47 || ((0x500000001U >> ((ulong)(__fd_00 - 0x47) & 0x3f) & 1) == 0)))) {
      accept(__fd_00,__addr_00,__addr_len_02);
    }
  }
  else {
    make_socket_noninheritable(iVar4);
    ptVar1 = (this->super_stream_listener_base_t).super_own_t.options.tcp_accept_filters.
             super__Vector_base<zmq::tcp_address_mask_t,_std::allocator<zmq::tcp_address_mask_t>_>.
             _M_impl.super__Vector_impl_data._M_start;
    ptVar2 = *(pointer *)
              ((long)&(this->super_stream_listener_base_t).super_own_t.options.tcp_accept_filters.
                      super__Vector_base<zmq::tcp_address_mask_t,_std::allocator<zmq::tcp_address_mask_t>_>
                      ._M_impl.super__Vector_impl_data + 8);
    if (ptVar1 == ptVar2) {
LAB_001891bf:
      iVar6 = set_nosigpipe(iVar4);
      if (iVar6 == 0) {
        iVar6 = (this->super_stream_listener_base_t).super_own_t.options.tos;
        if (iVar6 != 0) {
          set_ip_type_of_service(iVar4,iVar6);
        }
        iVar6 = (this->super_stream_listener_base_t).super_own_t.options.priority;
        if (iVar6 != 0) {
          set_socket_priority(iVar4,iVar6);
        }
      }
      else {
        iVar6 = iVar4;
        iVar5 = close(iVar4);
        iVar4 = -1;
        if (iVar5 != 0) {
          accept(iVar6,__addr_00,__addr_len_01);
        }
      }
    }
    else {
      lVar8 = (long)ptVar2 - (long)ptVar1 >> 5;
      lVar9 = 0;
      do {
        __addr_00 = &local_a8;
        bVar3 = tcp_address_mask_t::match_address
                          ((tcp_address_mask_t *)
                           ((long)&((this->super_stream_listener_base_t).super_own_t.options.
                                    tcp_accept_filters.
                                    super__Vector_base<zmq::tcp_address_mask_t,_std::allocator<zmq::tcp_address_mask_t>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_network_address +
                           lVar9),(sockaddr *)&local_a8,local_ac);
        if (bVar3) goto LAB_001891bf;
        lVar9 = lVar9 + 0x20;
        lVar8 = lVar8 + -1;
      } while (lVar8 != 0);
      iVar6 = iVar4;
      iVar5 = close(iVar4);
      iVar4 = -1;
      if (iVar5 != 0) {
        accept(iVar6,__addr_00,__addr_len_00);
      }
    }
  }
  return iVar4;
}

Assistant:

zmq::fd_t zmq::tcp_listener_t::accept ()
{
    //  The situation where connection cannot be accepted due to insufficient
    //  resources is considered valid and treated by ignoring the connection.
    //  Accept one connection and deal with different failure modes.
    zmq_assert (_s != retired_fd);

    struct sockaddr_storage ss;
    memset (&ss, 0, sizeof (ss));
#if defined ZMQ_HAVE_HPUX || defined ZMQ_HAVE_VXWORKS
    int ss_len = sizeof (ss);
#else
    socklen_t ss_len = sizeof (ss);
#endif
#if defined ZMQ_HAVE_SOCK_CLOEXEC && defined HAVE_ACCEPT4
    fd_t sock = ::accept4 (_s, reinterpret_cast<struct sockaddr *> (&ss),
                           &ss_len, SOCK_CLOEXEC);
#else
    const fd_t sock =
      ::accept (_s, reinterpret_cast<struct sockaddr *> (&ss), &ss_len);
#endif

    if (sock == retired_fd) {
#if defined ZMQ_HAVE_WINDOWS
        const int last_error = WSAGetLastError ();
        wsa_assert (last_error == WSAEWOULDBLOCK || last_error == WSAECONNRESET
                    || last_error == WSAEMFILE || last_error == WSAENOBUFS);
#elif defined ZMQ_HAVE_ANDROID
        errno_assert (errno == EAGAIN || errno == EWOULDBLOCK || errno == EINTR
                      || errno == ECONNABORTED || errno == EPROTO
                      || errno == ENOBUFS || errno == ENOMEM || errno == EMFILE
                      || errno == ENFILE || errno == EINVAL);
#else
        errno_assert (errno == EAGAIN || errno == EWOULDBLOCK || errno == EINTR
                      || errno == ECONNABORTED || errno == EPROTO
                      || errno == ENOBUFS || errno == ENOMEM || errno == EMFILE
                      || errno == ENFILE);
#endif
        return retired_fd;
    }

    make_socket_noninheritable (sock);

    if (!options.tcp_accept_filters.empty ()) {
        bool matched = false;
        for (options_t::tcp_accept_filters_t::size_type
               i = 0,
               size = options.tcp_accept_filters.size ();
             i != size; ++i) {
            if (options.tcp_accept_filters[i].match_address (
                  reinterpret_cast<struct sockaddr *> (&ss), ss_len)) {
                matched = true;
                break;
            }
        }
        if (!matched) {
#ifdef ZMQ_HAVE_WINDOWS
            const int rc = closesocket (sock);
            wsa_assert (rc != SOCKET_ERROR);
#else
            int rc = ::close (sock);
            errno_assert (rc == 0);
#endif
            return retired_fd;
        }
    }

    if (zmq::set_nosigpipe (sock)) {
#ifdef ZMQ_HAVE_WINDOWS
        const int rc = closesocket (sock);
        wsa_assert (rc != SOCKET_ERROR);
#else
        int rc = ::close (sock);
        errno_assert (rc == 0);
#endif
        return retired_fd;
    }

    // Set the IP Type-Of-Service priority for this client socket
    if (options.tos != 0)
        set_ip_type_of_service (sock, options.tos);

    // Set the protocol-defined priority for this client socket
    if (options.priority != 0)
        set_socket_priority (sock, options.priority);

    return sock;
}